

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

double __thiscall imrt::Station::intensityDown(Station *this,int i,int j)

{
  double *pdVar1;
  _Self __tmp;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  double dVar7;
  
  pdVar1 = (this->I).p[i];
  dVar7 = pdVar1[j];
  if ((0.0 < dVar7) &&
     ((((j == 0 || ((this->I).cols_ == j)) ||
       (pdVar1[(long)j + -1] <= dVar7 && dVar7 != pdVar1[(long)j + -1])) ||
      (pdVar1[(long)j + 1] <= dVar7 && dVar7 != pdVar1[(long)j + 1])))) {
    p_Var4 = (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != (_Rb_tree_node_base *)0x0) {
      iVar5 = (int)dVar7;
      p_Var6 = p_Var2;
      do {
        if (iVar5 <= (int)p_Var4[1]._M_color) {
          p_Var6 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar5];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((p_Var6 != p_Var2) && ((int)p_Var6[1]._M_color <= iVar5)) {
        p_Var2 = p_Var6;
      }
    }
    if (p_Var2 == (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      dVar7 = 0.0;
    }
    else {
      lVar3 = std::_Rb_tree_decrement(p_Var2);
      dVar7 = (double)*(int *)(lVar3 + 0x20);
    }
  }
  return dVar7;
}

Assistant:

double Station::intensityDown(int i, int j){
    if(I(i,j)<=0) return I(i,j);
    if(j==0 || j==I.nb_cols() ||
        I(i,j-1)<I(i,j) || I(i,j+1)<I(i,j) ){
            //previous available intensity
            map< int, int >::iterator it = int2nb.find(I(i,j));
            if(it!=int2nb.begin()){
              it--; return it->first;
            }else
              return 0.0;
     }
    return I(i,j);
  }